

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsDirWrapper.cpp
# Opt level: O2

void * __thiscall TlsDirWrapper::getTlsDirPtr(TlsDirWrapper *this)

{
  Executable *pEVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  if (iVar2 == 0x20) {
    uVar4 = 0x18;
  }
  else {
    iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
              [0xb])();
    uVar4 = 0x28;
    if (iVar2 != 0x40) {
      uVar4 = 0;
    }
  }
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  UNRECOVERED_JUMPTABLE = (pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pEVar1,oVar3,2,uVar4,0,UNRECOVERED_JUMPTABLE);
  return (void *)CONCAT44(extraout_var,iVar2);
}

Assistant:

void* TlsDirWrapper::getTlsDirPtr()
{
    bufsize_t dirSize = 0;

    if (m_Exe->getBitMode() == Executable::BITS_32) {
        dirSize = sizeof(IMAGE_TLS_DIRECTORY32);
    } else if (m_Exe->getBitMode() == Executable::BITS_64) {
        dirSize = sizeof(IMAGE_TLS_DIRECTORY64);
    }

    offset_t rva = getDirEntryAddress();
    BYTE *ptr = m_Exe->getContentAt(rva, Executable::RVA, dirSize);
    return ptr;
}